

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinition.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::ProgramInterfaceDefinition::Program::~Program(Program *this)

{
  StructType *this_00;
  pointer ppSVar1;
  _Rb_tree_node_base *p_Var2;
  Shader *pSVar3;
  pointer ppSVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
  structTypes;
  _Rb_tree<const_glu::StructType_*,_const_glu::StructType_*,_std::_Identity<const_glu::StructType_*>,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppSVar1 = (this->m_shaders).
            super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < (int)((ulong)((long)(this->m_shaders).
                              super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1) >> 3)) {
    lVar11 = 0;
    do {
      pSVar3 = ppSVar1[lVar11];
      lVar5 = *(long *)&(pSVar3->m_defaultBlock).variables.
                        super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                        ._M_impl;
      if (0 < (int)((ulong)((long)*(pointer *)
                                   ((long)&(pSVar3->m_defaultBlock).variables.
                                           super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                   + 8) - lVar5) >> 5) * -0x55555555) {
        lVar7 = 0x20;
        lVar9 = 0;
        do {
          collectStructPtrs((set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
                             *)&local_60,(VarType *)(lVar5 + lVar7));
          lVar9 = lVar9 + 1;
          ppSVar1 = (this->m_shaders).
                    super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pSVar3 = ppSVar1[lVar11];
          lVar5 = *(long *)&(pSVar3->m_defaultBlock).variables.
                            super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                            ._M_impl;
          lVar7 = lVar7 + 0x60;
        } while (lVar9 < (int)((ulong)((long)*(pointer *)
                                              ((long)&(pSVar3->m_defaultBlock).variables.
                                                                                                            
                                                  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                              + 8) - lVar5) >> 5) * -0x55555555);
      }
      lVar5 = *(long *)&(pSVar3->m_defaultBlock).interfaceBlocks.
                        super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                        ._M_impl.super__Vector_impl_data;
      if (0 < (int)((ulong)((long)*(pointer *)
                                   ((long)&(pSVar3->m_defaultBlock).interfaceBlocks.
                                           super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                   + 8) - lVar5) >> 4) * 0x38e38e39) {
        lVar7 = 0;
        do {
          lVar6 = lVar7 * 0x90;
          lVar9 = *(long *)(lVar5 + 0x60 + lVar6);
          if (0 < (int)((ulong)(*(long *)(lVar5 + 0x68 + lVar6) - lVar9) >> 5) * -0x55555555) {
            lVar8 = 0x20;
            lVar10 = 0;
            do {
              collectStructPtrs((set<const_glu::StructType_*,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
                                 *)&local_60,(VarType *)(lVar9 + lVar8));
              lVar10 = lVar10 + 1;
              ppSVar1 = (this->m_shaders).
                        super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pSVar3 = ppSVar1[lVar11];
              lVar5 = *(long *)&(pSVar3->m_defaultBlock).interfaceBlocks.
                                super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                ._M_impl.super__Vector_impl_data;
              lVar9 = *(long *)(lVar5 + 0x60 + lVar6);
              lVar8 = lVar8 + 0x60;
            } while (lVar10 < (int)((ulong)(*(long *)(lVar5 + 0x68 + lVar6) - lVar9) >> 5) *
                              -0x55555555);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < (int)((ulong)((long)*(pointer *)
                                              ((long)&(pSVar3->m_defaultBlock).interfaceBlocks.
                                                                                                            
                                                  super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                              + 8) - lVar5) >> 4) * 0x38e38e39);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (int)((ulong)((long)(this->m_shaders).
                                          super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1
                                   ) >> 3));
    for (p_Var2 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &local_60._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      this_00 = *(StructType **)(p_Var2 + 1);
      if (this_00 != (StructType *)0x0) {
        glu::StructType::~StructType(this_00);
      }
      operator_delete(this_00,0x38);
    }
  }
  std::
  _Rb_tree<const_glu::StructType_*,_const_glu::StructType_*,_std::_Identity<const_glu::StructType_*>,_std::less<const_glu::StructType_*>,_std::allocator<const_glu::StructType_*>_>
  ::~_Rb_tree(&local_60);
  ppSVar1 = (this->m_shaders).
            super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppSVar4 = (this->m_shaders).
            super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppSVar4 - (long)ppSVar1) >> 3)) {
    lVar11 = 0;
    do {
      pSVar3 = ppSVar1[lVar11];
      if (pSVar3 != (Shader *)0x0) {
        std::vector<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>::~vector
                  (&(pSVar3->m_defaultBlock).interfaceBlocks);
        std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::~vector
                  (&(pSVar3->m_defaultBlock).variables);
      }
      operator_delete(pSVar3,0x38);
      lVar11 = lVar11 + 1;
      ppSVar1 = (this->m_shaders).
                super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppSVar4 = (this->m_shaders).
                super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (lVar11 < (int)((ulong)((long)ppSVar4 - (long)ppSVar1) >> 3));
  }
  if (ppSVar4 != ppSVar1) {
    (this->m_shaders).
    super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppSVar1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->m_xfbVaryings);
  ppSVar1 = (this->m_shaders).
            super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppSVar1 != (pointer)0x0) {
    operator_delete(ppSVar1,(long)(this->m_shaders).
                                  super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar1
                   );
  }
  return;
}

Assistant:

Program::~Program (void)
{
	// delete shader struct types, need to be done by the program since shaders might share struct types
	{
		std::set<const glu::StructType*> structTypes;

		for (int shaderNdx = 0; shaderNdx < (int)m_shaders.size(); ++shaderNdx)
		{
			for (int varNdx = 0; varNdx < (int)m_shaders[shaderNdx]->m_defaultBlock.variables.size(); ++varNdx)
				collectStructPtrs(structTypes, m_shaders[shaderNdx]->m_defaultBlock.variables[varNdx].varType);

			for (int interfaceNdx = 0; interfaceNdx < (int)m_shaders[shaderNdx]->m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
				for (int varNdx = 0; varNdx < (int)m_shaders[shaderNdx]->m_defaultBlock.interfaceBlocks[interfaceNdx].variables.size(); ++varNdx)
					collectStructPtrs(structTypes, m_shaders[shaderNdx]->m_defaultBlock.interfaceBlocks[interfaceNdx].variables[varNdx].varType);
		}

		for (std::set<const glu::StructType*>::iterator it = structTypes.begin(); it != structTypes.end(); ++it)
			delete *it;
	}

	for (int shaderNdx = 0; shaderNdx < (int)m_shaders.size(); ++shaderNdx)
		delete m_shaders[shaderNdx];
	m_shaders.clear();
}